

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O0

int xio_close(XIO_HANDLE xio,ON_IO_CLOSE_COMPLETE on_io_close_complete,void *callback_context)

{
  int iVar1;
  XIO_INSTANCE *xio_instance;
  int result;
  void *callback_context_local;
  ON_IO_CLOSE_COMPLETE on_io_close_complete_local;
  XIO_HANDLE xio_local;
  
  if (xio == (XIO_HANDLE)0x0) {
    xio_instance._4_4_ = 0x6e;
  }
  else {
    iVar1 = (*xio->io_interface_description->concrete_io_close)
                      (xio->concrete_xio_handle,on_io_close_complete,callback_context);
    if (iVar1 == 0) {
      xio_instance._4_4_ = 0;
    }
    else {
      xio_instance._4_4_ = 0x78;
    }
  }
  return xio_instance._4_4_;
}

Assistant:

int xio_close(XIO_HANDLE xio, ON_IO_CLOSE_COMPLETE on_io_close_complete, void* callback_context)
{
    int result;

    if (xio == NULL)
    {
        /* Codes_SRS_XIO_01_025: [If handle is NULL, xio_close shall return a non-zero value.] */
        result = MU_FAILURE;
    }
    else
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;

        /* Codes_SRS_XIO_01_023: [xio_close shall call the specific concrete_io_close function specified in xio_create.] */
        if (xio_instance->io_interface_description->concrete_io_close(xio_instance->concrete_xio_handle, on_io_close_complete, callback_context) != 0)
        {
            /* Codes_SRS_XIO_01_026: [If the underlying concrete_io_close fails, xio_close shall return a non-zero value.] */
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_XIO_01_024: [On success, xio_close shall return 0.] */
            result = 0;
        }
    }

    return result;
}